

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O1

int load_real_openal(void)

{
  char *__s;
  size_t sVar1;
  char *__s_00;
  bool bVar2;
  int okay;
  int local_24;
  
  realdll = (void *)dlopen();
  if (realdll == (void *)0x0) {
    load_real_openal_cold_1();
  }
  if (realdll == (void *)0x0) {
    __s = getcwd((char *)0x0,0);
    if (__s != (char *)0x0) {
      sVar1 = strlen(__s);
      __s_00 = (char *)malloc(sVar1 + 0x10);
      if (__s_00 != (char *)0x0) {
        snprintf(__s_00,sVar1 + 0x10,"%s/%s",__s,"libopenal.so.1");
        realdll = (void *)dlopen("libopenal.so.1",2);
        if (realdll == (void *)0x0) {
          load_real_openal_cold_2();
        }
        free(__s_00);
      }
      free(__s);
    }
  }
  bVar2 = realdll == (void *)0x0;
  if (bVar2) {
    load_real_openal_cold_3();
  }
  else {
    REAL_alcGetCurrentContext =
         (_func_ALCcontext_ptr *)loadEntryPoint(realdll,"alcGetCurrentContext",0,&local_24);
    REAL_alcGetContextsDevice =
         (_func_ALCdevice_ptr_ALCcontext_ptr *)
         loadEntryPoint(realdll,"alcGetContextsDevice",0,&local_24);
    REAL_alcIsExtensionPresent =
         (_func_ALCboolean_ALCdevice_ptr_ALCchar_ptr *)
         loadEntryPoint(realdll,"alcIsExtensionPresent",0,&local_24);
    REAL_alcGetProcAddress =
         (_func_void_ptr_ALCdevice_ptr_ALCchar_ptr *)
         loadEntryPoint(realdll,"alcGetProcAddress",0,&local_24);
    REAL_alcGetEnumValue =
         (_func_ALCenum_ALCdevice_ptr_ALCchar_ptr *)
         loadEntryPoint(realdll,"alcGetEnumValue",0,&local_24);
    REAL_alcGetString =
         (_func_ALCchar_ptr_ALCdevice_ptr_ALCenum *)
         loadEntryPoint(realdll,"alcGetString",0,&local_24);
    REAL_alcCaptureOpenDevice =
         (_func_ALCdevice_ptr_ALCchar_ptr_ALCuint_ALCenum_ALCsizei *)
         loadEntryPoint(realdll,"alcCaptureOpenDevice",0,&local_24);
    REAL_alcCaptureCloseDevice =
         (_func_ALCboolean_ALCdevice_ptr *)
         loadEntryPoint(realdll,"alcCaptureCloseDevice",0,&local_24);
    REAL_alcOpenDevice =
         (_func_ALCdevice_ptr_ALCchar_ptr *)loadEntryPoint(realdll,"alcOpenDevice",0,&local_24);
    REAL_alcCloseDevice =
         (_func_ALCboolean_ALCdevice_ptr *)loadEntryPoint(realdll,"alcCloseDevice",0,&local_24);
    REAL_alcCreateContext =
         (_func_ALCcontext_ptr_ALCdevice_ptr_ALCint_ptr *)
         loadEntryPoint(realdll,"alcCreateContext",0,&local_24);
    REAL_alcMakeContextCurrent =
         (_func_ALCboolean_ALCcontext_ptr *)
         loadEntryPoint(realdll,"alcMakeContextCurrent",0,&local_24);
    REAL_alcProcessContext =
         (_func_void_ALCcontext_ptr *)loadEntryPoint(realdll,"alcProcessContext",0,&local_24);
    REAL_alcSuspendContext =
         (_func_void_ALCcontext_ptr *)loadEntryPoint(realdll,"alcSuspendContext",0,&local_24);
    REAL_alcDestroyContext =
         (_func_void_ALCcontext_ptr *)loadEntryPoint(realdll,"alcDestroyContext",0,&local_24);
    REAL_alcGetError =
         (_func_ALCenum_ALCdevice_ptr *)loadEntryPoint(realdll,"alcGetError",0,&local_24);
    REAL_alcGetIntegerv =
         (_func_void_ALCdevice_ptr_ALCenum_ALCsizei_ALCint_ptr *)
         loadEntryPoint(realdll,"alcGetIntegerv",0,&local_24);
    REAL_alcCaptureStart =
         (_func_void_ALCdevice_ptr *)loadEntryPoint(realdll,"alcCaptureStart",0,&local_24);
    REAL_alcCaptureStop =
         (_func_void_ALCdevice_ptr *)loadEntryPoint(realdll,"alcCaptureStop",0,&local_24);
    REAL_alcCaptureSamples =
         (_func_void_ALCdevice_ptr_ALCvoid_ptr_ALCsizei *)
         loadEntryPoint(realdll,"alcCaptureSamples",0,&local_24);
    REAL_alDopplerFactor =
         (_func_void_ALfloat *)loadEntryPoint(realdll,"alDopplerFactor",0,&local_24);
    REAL_alDopplerVelocity =
         (_func_void_ALfloat *)loadEntryPoint(realdll,"alDopplerVelocity",0,&local_24);
    REAL_alSpeedOfSound = (_func_void_ALfloat *)loadEntryPoint(realdll,"alSpeedOfSound",0,&local_24)
    ;
    REAL_alDistanceModel =
         (_func_void_ALenum *)loadEntryPoint(realdll,"alDistanceModel",0,&local_24);
    REAL_alEnable = (_func_void_ALenum *)loadEntryPoint(realdll,"alEnable",0,&local_24);
    REAL_alDisable = (_func_void_ALenum *)loadEntryPoint(realdll,"alDisable",0,&local_24);
    REAL_alIsEnabled = (_func_ALboolean_ALenum *)loadEntryPoint(realdll,"alIsEnabled",0,&local_24);
    REAL_alGetString = (_func_ALchar_ptr_ALenum *)loadEntryPoint(realdll,"alGetString",0,&local_24);
    REAL_alGetBooleanv =
         (_func_void_ALenum_ALboolean_ptr *)loadEntryPoint(realdll,"alGetBooleanv",0,&local_24);
    REAL_alGetIntegerv =
         (_func_void_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetIntegerv",0,&local_24);
    REAL_alGetFloatv =
         (_func_void_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetFloatv",0,&local_24);
    REAL_alGetDoublev =
         (_func_void_ALenum_ALdouble_ptr *)loadEntryPoint(realdll,"alGetDoublev",0,&local_24);
    REAL_alGetBoolean = (_func_ALboolean_ALenum *)loadEntryPoint(realdll,"alGetBoolean",0,&local_24)
    ;
    REAL_alGetInteger = (_func_ALint_ALenum *)loadEntryPoint(realdll,"alGetInteger",0,&local_24);
    REAL_alGetFloat = (_func_ALfloat_ALenum *)loadEntryPoint(realdll,"alGetFloat",0,&local_24);
    REAL_alGetDouble = (_func_ALdouble_ALenum *)loadEntryPoint(realdll,"alGetDouble",0,&local_24);
    REAL_alIsExtensionPresent =
         (_func_ALboolean_ALchar_ptr *)loadEntryPoint(realdll,"alIsExtensionPresent",0,&local_24);
    REAL_alGetError = (_func_ALenum *)loadEntryPoint(realdll,"alGetError",0,&local_24);
    REAL_alGetProcAddress =
         (_func_void_ptr_ALchar_ptr *)loadEntryPoint(realdll,"alGetProcAddress",0,&local_24);
    REAL_alGetEnumValue =
         (_func_ALenum_ALchar_ptr *)loadEntryPoint(realdll,"alGetEnumValue",0,&local_24);
    REAL_alListenerfv =
         (_func_void_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alListenerfv",0,&local_24);
    REAL_alListenerf =
         (_func_void_ALenum_ALfloat *)loadEntryPoint(realdll,"alListenerf",0,&local_24);
    REAL_alListener3f =
         (_func_void_ALenum_ALfloat_ALfloat_ALfloat *)
         loadEntryPoint(realdll,"alListener3f",0,&local_24);
    REAL_alListeneriv =
         (_func_void_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alListeneriv",0,&local_24);
    REAL_alListeneri = (_func_void_ALenum_ALint *)loadEntryPoint(realdll,"alListeneri",0,&local_24);
    REAL_alListener3i =
         (_func_void_ALenum_ALint_ALint_ALint *)loadEntryPoint(realdll,"alListener3i",0,&local_24);
    REAL_alGetListenerfv =
         (_func_void_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetListenerfv",0,&local_24);
    REAL_alGetListenerf =
         (_func_void_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetListenerf",0,&local_24);
    REAL_alGetListener3f =
         (_func_void_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetListener3f",0,&local_24);
    REAL_alGetListeneri =
         (_func_void_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetListeneri",0,&local_24);
    REAL_alGetListeneriv =
         (_func_void_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetListeneriv",0,&local_24);
    REAL_alGetListener3i =
         (_func_void_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)
         loadEntryPoint(realdll,"alGetListener3i",0,&local_24);
    REAL_alGenSources =
         (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alGenSources",0,&local_24);
    REAL_alDeleteSources =
         (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alDeleteSources",0,&local_24);
    REAL_alIsSource = (_func_ALboolean_ALuint *)loadEntryPoint(realdll,"alIsSource",0,&local_24);
    REAL_alSourcefv =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alSourcefv",0,&local_24);
    REAL_alSourcef =
         (_func_void_ALuint_ALenum_ALfloat *)loadEntryPoint(realdll,"alSourcef",0,&local_24);
    REAL_alSource3f =
         (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)
         loadEntryPoint(realdll,"alSource3f",0,&local_24);
    REAL_alSourceiv =
         (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alSourceiv",0,&local_24);
    REAL_alSourcei =
         (_func_void_ALuint_ALenum_ALint *)loadEntryPoint(realdll,"alSourcei",0,&local_24);
    REAL_alSource3i =
         (_func_void_ALuint_ALenum_ALint_ALint_ALint *)
         loadEntryPoint(realdll,"alSource3i",0,&local_24);
    REAL_alGetSourcefv =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetSourcefv",0,&local_24)
    ;
    REAL_alGetSourcef =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetSourcef",0,&local_24);
    REAL_alGetSource3f =
         (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetSource3f",0,&local_24);
    REAL_alGetSourceiv =
         (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetSourceiv",0,&local_24);
    REAL_alGetSourcei =
         (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetSourcei",0,&local_24);
    REAL_alGetSource3i =
         (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)
         loadEntryPoint(realdll,"alGetSource3i",0,&local_24);
    REAL_alSourcePlay = (_func_void_ALuint *)loadEntryPoint(realdll,"alSourcePlay",0,&local_24);
    REAL_alSourcePlayv =
         (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alSourcePlayv",0,&local_24);
    REAL_alSourcePause = (_func_void_ALuint *)loadEntryPoint(realdll,"alSourcePause",0,&local_24);
    REAL_alSourcePausev =
         (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alSourcePausev",0,&local_24);
    REAL_alSourceRewind = (_func_void_ALuint *)loadEntryPoint(realdll,"alSourceRewind",0,&local_24);
    REAL_alSourceRewindv =
         (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alSourceRewindv",0,&local_24);
    REAL_alSourceStop = (_func_void_ALuint *)loadEntryPoint(realdll,"alSourceStop",0,&local_24);
    REAL_alSourceStopv =
         (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alSourceStopv",0,&local_24);
    REAL_alSourceQueueBuffers =
         (_func_void_ALuint_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alSourceQueueBuffers",0,&local_24);
    REAL_alSourceUnqueueBuffers =
         (_func_void_ALuint_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alSourceUnqueueBuffers",0,&local_24);
    REAL_alGenBuffers =
         (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alGenBuffers",0,&local_24);
    REAL_alDeleteBuffers =
         (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alDeleteBuffers",0,&local_24);
    REAL_alIsBuffer = (_func_ALboolean_ALuint *)loadEntryPoint(realdll,"alIsBuffer",0,&local_24);
    REAL_alBufferData =
         (_func_void_ALuint_ALenum_ALvoid_ptr_ALsizei_ALsizei *)
         loadEntryPoint(realdll,"alBufferData",0,&local_24);
    REAL_alBufferfv =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alBufferfv",0,&local_24);
    REAL_alBufferf =
         (_func_void_ALuint_ALenum_ALfloat *)loadEntryPoint(realdll,"alBufferf",0,&local_24);
    REAL_alBuffer3f =
         (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)
         loadEntryPoint(realdll,"alBuffer3f",0,&local_24);
    REAL_alBufferiv =
         (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alBufferiv",0,&local_24);
    REAL_alBufferi =
         (_func_void_ALuint_ALenum_ALint *)loadEntryPoint(realdll,"alBufferi",0,&local_24);
    REAL_alBuffer3i =
         (_func_void_ALuint_ALenum_ALint_ALint_ALint *)
         loadEntryPoint(realdll,"alBuffer3i",0,&local_24);
    REAL_alGetBufferfv =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetBufferfv",0,&local_24)
    ;
    REAL_alGetBufferf =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetBufferf",0,&local_24);
    REAL_alGetBuffer3f =
         (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetBuffer3f",0,&local_24);
    REAL_alGetBufferi =
         (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetBufferi",0,&local_24);
    REAL_alGetBuffer3i =
         (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)
         loadEntryPoint(realdll,"alGetBuffer3i",0,&local_24);
    REAL_alGetBufferiv =
         (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetBufferiv",0,&local_24);
    REAL_alTracePushScope = (_func_void_ALchar_ptr *)dlsym(realdll,"alTracePushScope");
    REAL_alTracePopScope = (_func_void *)dlsym(realdll,"alTracePopScope");
    REAL_alTraceMessage = (_func_void_ALchar_ptr *)dlsym(realdll,"alTraceMessage");
    REAL_alTraceBufferLabel = (_func_void_ALuint_ALchar_ptr *)dlsym(realdll,"alTraceBufferLabel");
    REAL_alTraceSourceLabel = (_func_void_ALuint_ALchar_ptr *)dlsym(realdll,"alTraceSourceLabel");
    REAL_alcTraceDeviceLabel =
         (_func_void_ALCdevice_ptr_ALchar_ptr *)dlsym(realdll,"alcTraceDeviceLabel");
    REAL_alcTraceContextLabel =
         (_func_void_ALCcontext_ptr_ALchar_ptr *)dlsym(realdll,"alcTraceContextLabel");
  }
  return (uint)!bVar2;
}

Assistant:

int load_real_openal(void)
{
    int extensions = 0;
    int okay = 1;
    #ifdef __APPLE__
    const char *dllname = "libopenal.1.dylib";
    #elif defined(_WIN32)
    const char *dllname = "openal32.dll";
    #else
    const char *dllname = "libopenal.so.1";
    #endif

    realdll = dlopen(dllname, RTLD_NOW | RTLD_LOCAL);
    if (!realdll) {
        fprintf(stderr, "%s: Failed to load %s: %s\n", GAppName, dllname, dlerror());
        fflush(stderr);
    }

    if (!realdll) {
        // Not in the libpath? See if we can find it in the cwd.
        char *cwd = getcwd(NULL, 0);
        if (cwd) {
            const size_t fulllen = strlen(cwd) + strlen(dllname) + 2;
            char *fullpath = (char *) malloc(fulllen);
            if (fullpath) {
                snprintf(fullpath, fulllen, "%s/%s", cwd, dllname);
                realdll = dlopen(dllname, RTLD_NOW | RTLD_LOCAL);
                if (!realdll) {
                    fprintf(stderr, "%s: Failed to load %s: %s\n", GAppName, fullpath, dlerror());
                    fflush(stderr);
                }
                free(fullpath);
            }
            free(cwd);
        }
    }

    if (!realdll) {
        fprintf(stderr, "%s: Couldn't load OpenAL from anywhere obvious. Giving up.\n", GAppName);
        fflush(stderr);
        return 0;
    }

    #define ENTRYPOINT_EXTENSIONS_BEGIN() extensions = 1;
    #define ENTRYPOINT(ret,name,params,args,numargs,visitparams,visitargs) REAL_##name = (ret (*)params) loadEntryPoint(realdll, #name, extensions, &okay);
    #include "altrace_entrypoints.h"
    return okay;
}